

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBaseGL.cpp
# Opt level: O0

void __thiscall Diligent::TextureBaseGL::~TextureBaseGL(TextureBaseGL *this)

{
  RenderDeviceGLImpl *this_00;
  TextureBaseGL *this_local;
  
  (this->super_TextureBase<Diligent::EngineGLImplTraits>).
  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>.
  super_ObjectBase<Diligent::ITextureGL>.super_RefCountedObject<Diligent::ITextureGL>.
  super_ITextureGL.super_ITexture.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_00592fe8;
  this_00 = DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
            ::GetDevice((DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                         *)this);
  RenderDeviceGLImpl::OnReleaseTexture(this_00,(ITexture *)this);
  RefCntAutoPtr<Diligent::IBuffer>::~RefCntAutoPtr(&this->m_pPBO);
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::~GLObjWrapper
            (&this->m_GlTexture);
  TextureBase<Diligent::EngineGLImplTraits>::~TextureBase
            (&this->super_TextureBase<Diligent::EngineGLImplTraits>);
  return;
}

Assistant:

TextureBaseGL::~TextureBaseGL()
{
    // Release all FBOs that contain current texture
    // NOTE: we cannot check if BIND_RENDER_TARGET
    // flag is set, because CopyData() can bind
    // texture as render target even when no flag
    // is set
    GetDevice()->OnReleaseTexture(this);
}